

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  getattrfunc p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  ushort uVar4;
  pointer paVar5;
  long lVar6;
  function_record *pfVar7;
  bool bVar8;
  uint __val;
  uint uVar9;
  char cVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  long *plVar14;
  undefined8 *puVar15;
  type_info *ptVar16;
  detail *pdVar17;
  function_record *pfVar18;
  PyMethodDef *pPVar19;
  object *poVar20;
  PyObject *pPVar21;
  PyObject *pPVar22;
  inquiry p_Var23;
  error_already_set *this_00;
  ushort uVar24;
  PyTypeObject *pPVar25;
  ulong *puVar26;
  size_type *psVar27;
  ulong uVar28;
  function_record *pfVar29;
  ulong uVar30;
  long *plVar31;
  handle *handle;
  handle *handle_00;
  handle *handle_01;
  handle *handle_02;
  pointer paVar32;
  char cVar33;
  undefined8 uVar34;
  getattrfunc p_Var35;
  function_record *pfVar36;
  uint __len;
  uint uVar37;
  ulong __val_00;
  undefined1 auVar38 [16];
  string signatures;
  capsule rec_capsule_2;
  object scope_module;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [32];
  PyMappingMethods *local_180;
  undefined1 local_178 [39];
  allocator<char> local_151;
  PyBufferProcs *local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  cpp_function *local_128;
  ulong local_120;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  strdup_guard local_f8;
  function_record *local_d8;
  undefined1 local_d0 [16];
  char *local_c0;
  object local_b8;
  unique_function_record *local_b0;
  inquiry local_a8;
  PyObject *local_a0;
  str local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar36 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar13 = "";
  if (pfVar36->name != (char *)0x0) {
    pcVar13 = pfVar36->name;
  }
  local_150 = (PyBufferProcs *)types;
  local_128 = this;
  local_120 = args;
  local_b0 = unique_rec;
  pcVar13 = strdup_guard::operator()(&local_f8,pcVar13);
  pfVar36->name = pcVar13;
  if (pfVar36->doc != (char *)0x0) {
    pcVar13 = strdup_guard::operator()(&local_f8,pfVar36->doc);
    pfVar36->doc = pcVar13;
  }
  paVar32 = (pfVar36->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar5 = *(pointer *)
            ((long)&(pfVar36->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  if (paVar32 != paVar5) {
    do {
      if (paVar32->name != (char *)0x0) {
        pcVar13 = strdup_guard::operator()(&local_f8,paVar32->name);
        paVar32->name = pcVar13;
      }
      if (paVar32->descr == (char *)0x0) {
        if ((paVar32->value).m_ptr != (PyObject *)0x0) {
          auVar38 = PyObject_Repr();
          if (auVar38._0_8_ == (getiterfunc)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_118._0_8_ = auVar38._0_8_;
          cast<std::__cxx11::string>
                    ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_200,(pybind11 *)local_118,auVar38._8_8_);
          pcVar13 = strdup_guard::operator()(&local_f8,(char *)local_200._0_8_);
          paVar32->descr = pcVar13;
          if ((PyTypeObject *)local_200._0_8_ != (PyTypeObject *)local_1f0) {
            operator_delete((void *)local_200._0_8_,(ulong)(local_1f0._0_8_ + 1));
          }
          object::~object((object *)local_118);
        }
      }
      else {
        pcVar13 = strdup_guard::operator()(&local_f8,paVar32->descr);
        paVar32->descr = pcVar13;
      }
      paVar32 = paVar32 + 1;
    } while (paVar32 != paVar5);
  }
  pcVar13 = pfVar36->name;
  iVar11 = strcmp(pcVar13,"__init__");
  if (iVar11 == 0) {
    uVar24 = 1;
  }
  else {
    iVar11 = strcmp(pcVar13,"__setstate__");
    uVar24 = (ushort)(iVar11 == 0);
  }
  uVar4 = *(ushort *)&pfVar36->field_0x59;
  *(ushort *)&pfVar36->field_0x59 = uVar4 & 0xfffe | uVar24;
  if (((uVar4 & 2) == 0 & (byte)uVar24) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_200,(char *)(pfVar36->scope).m_ptr[1].ob_type,
               (allocator<char> *)local_118);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,pfVar36->name,(allocator<char> *)(local_1f0 + 0x10));
    uVar34 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    plVar14 = (long *)std::__cxx11::string::append(local_148);
    pPVar25 = (PyTypeObject *)(plVar14 + 2);
    if ((PyTypeObject *)*plVar14 == pPVar25) {
      local_1a0._16_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
      local_1a0._24_8_ = plVar14[3];
      local_1a0._0_8_ = (PyObject *)(local_1a0 + 0x10);
    }
    else {
      local_1a0._16_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
      local_1a0._0_8_ = (PyObject *)*plVar14;
    }
    local_1a0._8_8_ = plVar14[1];
    *plVar14 = (long)pPVar25;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append(local_1a0,local_118._0_8_);
    puVar26 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar26) {
      local_1c0.field_2._M_allocated_capacity = *puVar26;
      local_1c0.field_2._8_8_ = plVar14[3];
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *puVar26;
      local_1c0._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_1c0._M_string_length = plVar14[1];
    *plVar14 = (long)puVar26;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
    psVar27 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar27) {
      local_1e0.field_2._M_allocated_capacity = *psVar27;
      local_1e0.field_2._8_8_ = puVar15[3];
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    }
    else {
      local_1e0.field_2._M_allocated_capacity = *psVar27;
      local_1e0._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_1e0._M_string_length = puVar15[1];
    *puVar15 = psVar27;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    PyErr_WarnEx(uVar34,local_1e0._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,
                      (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
    }
    if ((PyObject *)local_1a0._0_8_ != (PyObject *)(local_1a0 + 0x10)) {
      operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
    }
    if ((undefined1 *)local_148._0_8_ != local_138) {
      operator_delete((void *)local_148._0_8_,(ulong)(local_138._0_8_ + 1));
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_,
                      CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1)
      ;
    }
    if ((PyTypeObject *)local_200._0_8_ != (PyTypeObject *)local_1f0) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_1f0._0_8_ + 1));
    }
  }
  local_a0 = (PyObject *)&pfVar36->args;
  local_118._0_8_ = local_118 + 0x10;
  local_118._8_8_ = (iternextfunc)0x0;
  local_108._M_local_buf[0] = '\0';
  local_a8 = (inquiry)local_1f0;
  uVar30 = 0;
  local_180 = (PyMappingMethods *)0x0;
  local_d8 = pfVar36;
  do {
    bVar3 = *text;
    if (bVar3 < 0x7b) {
      if (bVar3 == 0x25) {
        pPVar25 = (PyTypeObject *)(&local_150->bf_getbuffer)[(long)local_180];
        if (pPVar25 == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_200._0_8_ = pPVar25;
        ptVar16 = detail::get_type_info((type_index *)local_200,false);
        local_180 = (PyMappingMethods *)((long)&local_180->mp_length + 1);
        if (ptVar16 == (type_info *)0x0) {
          if ((uVar30 == 0 & (byte)pfVar36->field_0x59 >> 1) != 1) {
            pPVar25 = (pPVar25->ob_base).ob_base.ob_type;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_200,
                       (char *)((long)&(pPVar25->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar25->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator<char> *)(local_1f0 + 0x10));
            detail::clean_type_id((string *)local_200);
            std::__cxx11::string::_M_append(local_118,local_200._0_8_);
            if ((PyTypeObject *)local_200._0_8_ != (PyTypeObject *)local_1f0) {
              operator_delete((void *)local_200._0_8_,(ulong)(local_1f0._0_8_ + 1));
            }
            goto LAB_0010db01;
          }
          local_148._8_8_ = (pfVar36->scope).m_ptr;
          local_138._0_8_ = "__module__";
          local_138._8_8_ = (inquiry)0x0;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_148)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_200,pdVar17,handle_00);
          local_1a0._0_8_ = local_1a0 + 0x10;
          paVar2 = &local_1c0.field_2;
          if ((PyTypeObject *)local_200._0_8_ == (PyTypeObject *)local_1f0) {
            local_1a0._24_8_ = local_1f0._8_8_;
          }
          else {
            local_1a0._0_8_ = local_200._0_8_;
          }
          local_1a0._16_8_ = local_1f0._0_8_;
          local_1a0._8_8_ = local_200._8_8_;
          plVar14 = (long *)std::__cxx11::string::append(local_1a0);
          puVar26 = (ulong *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_1c0.field_2._M_allocated_capacity = *puVar26;
            local_1c0.field_2._8_8_ = plVar14[3];
            local_1c0._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1c0.field_2._M_allocated_capacity = *puVar26;
            local_1c0._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_1c0._M_string_length = plVar14[1];
          *plVar14 = (long)puVar26;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          local_d0._8_8_ = (pfVar36->scope).m_ptr;
          local_c0 = "__qualname__";
          local_b8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_d0);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_200,pdVar17,handle_02);
          local_178._0_8_ = local_200._0_8_;
          if ((PyTypeObject *)local_200._0_8_ == (PyTypeObject *)local_1f0) {
            local_178._24_8_ = local_1f0._8_8_;
            local_178._0_8_ = (PyTypeObject *)(local_178 + 0x10);
          }
          local_178._16_8_ = local_1f0._0_8_;
          local_178._8_8_ = local_200._8_8_;
          uVar34 = (getattrfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != paVar2) {
            uVar34 = local_1c0.field_2._M_allocated_capacity;
          }
          p_Var1 = (getattrfunc)((long)(Py_ssize_t *)local_200._8_8_ + local_1c0._M_string_length);
          if ((ulong)uVar34 < p_Var1) {
            p_Var35 = (getattrfunc)0xf;
            if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)(local_178 + 0x10)) {
              p_Var35 = (getattrfunc)local_1f0._0_8_;
            }
            if (p_Var35 < p_Var1) goto LAB_0010d8ff;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_178,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p);
          }
          else {
LAB_0010d8ff:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1c0,local_178._0_8_);
          }
          psVar27 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_1e0.field_2._M_allocated_capacity = *psVar27;
            local_1e0.field_2._8_8_ = puVar15[3];
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          }
          else {
            local_1e0.field_2._M_allocated_capacity = *psVar27;
            local_1e0._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_1e0._M_string_length = puVar15[1];
          *puVar15 = psVar27;
          puVar15[1] = 0;
          *(undefined1 *)psVar27 = 0;
          std::__cxx11::string::_M_append(local_118,(ulong)local_1e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
          }
          object::~object(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != paVar2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_1a0._0_8_ != (PyTypeObject *)(local_1a0 + 0x10)) {
            operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
          }
          object::~object((object *)(local_138 + 8));
          uVar30 = 0;
        }
        else {
          pPVar25 = ptVar16->type;
          local_138._0_8_ = "__module__";
          local_138._8_8_ = (inquiry)0x0;
          local_148._8_8_ = pPVar25;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_148)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_200,pdVar17,handle);
          local_1a0._0_8_ = local_1a0 + 0x10;
          if ((PyTypeObject *)local_200._0_8_ == (PyTypeObject *)local_1f0) {
            local_1a0._24_8_ = local_1f0._8_8_;
          }
          else {
            local_1a0._0_8_ = local_200._0_8_;
          }
          local_1a0._16_8_ = local_1f0._0_8_;
          local_1a0._8_8_ = local_200._8_8_;
          plVar14 = (long *)std::__cxx11::string::append(local_1a0);
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          puVar26 = (ulong *)(plVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar26) {
            local_1c0.field_2._M_allocated_capacity = *puVar26;
            local_1c0.field_2._8_8_ = plVar14[3];
          }
          else {
            local_1c0.field_2._M_allocated_capacity = *puVar26;
            local_1c0._M_dataplus._M_p = (pointer)*plVar14;
          }
          local_1c0._M_string_length = plVar14[1];
          *plVar14 = (long)puVar26;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          local_c0 = "__qualname__";
          local_b8.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_d0._8_8_ = pPVar25;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_d0);
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_200,pdVar17,handle_01);
          local_178._0_8_ = local_200._0_8_;
          if ((PyTypeObject *)local_200._0_8_ == (PyTypeObject *)local_1f0) {
            local_178._24_8_ = local_1f0._8_8_;
            local_178._0_8_ = (PyTypeObject *)(local_178 + 0x10);
          }
          local_178._16_8_ = local_1f0._0_8_;
          local_178._8_8_ = local_200._8_8_;
          uVar34 = (getattrfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            uVar34 = local_1c0.field_2._M_allocated_capacity;
          }
          p_Var1 = (getattrfunc)((long)(Py_ssize_t *)local_200._8_8_ + local_1c0._M_string_length);
          if ((ulong)uVar34 < p_Var1) {
            p_Var35 = (getattrfunc)0xf;
            if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)(local_178 + 0x10)) {
              p_Var35 = (getattrfunc)local_1f0._0_8_;
            }
            if (p_Var35 < p_Var1) goto LAB_0010d663;
            puVar15 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)local_178,0,(char *)0x0,(ulong)local_1c0._M_dataplus._M_p);
          }
          else {
LAB_0010d663:
            puVar15 = (undefined8 *)
                      std::__cxx11::string::_M_append((char *)&local_1c0,local_178._0_8_);
          }
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          psVar27 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar27) {
            local_1e0.field_2._M_allocated_capacity = *psVar27;
            local_1e0.field_2._8_8_ = puVar15[3];
          }
          else {
            local_1e0.field_2._M_allocated_capacity = *psVar27;
            local_1e0._M_dataplus._M_p = (pointer)*puVar15;
          }
          local_1e0._M_string_length = puVar15[1];
          *puVar15 = psVar27;
          puVar15[1] = 0;
          *(undefined1 *)psVar27 = 0;
          std::__cxx11::string::_M_append(local_118,(ulong)local_1e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if ((PyTypeObject *)local_178._0_8_ != (PyTypeObject *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
          }
          object::~object(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,
                            (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
          }
          if ((PyTypeObject *)local_1a0._0_8_ != (PyTypeObject *)(local_1a0 + 0x10)) {
            operator_delete((void *)local_1a0._0_8_,(ulong)(local_1a0._16_8_ + 1));
          }
          object::~object((object *)(local_138 + 8));
        }
      }
      else {
        if (bVar3 == 0) break;
LAB_0010d481:
        std::__cxx11::string::push_back((char)local_118);
      }
    }
    else if (bVar3 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        if (uVar30 + pfVar36->nargs_kw_only == local_120 && pfVar36->nargs_kw_only != 0) {
          std::__cxx11::string::append(local_118);
        }
        lVar6 = (long)(pfVar36->args).
                      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if (((uVar30 < (ulong)((long)*(pointer *)
                                      ((long)&(pfVar36->args).
                                              super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                              ._M_impl + 8) - lVar6 >> 5)) &&
            (*(long *)(lVar6 + uVar30 * 0x20) != 0)) ||
           ((*(ushort *)&pfVar36->field_0x59 & 0x10) != 0 && uVar30 == 0)) {
          std::__cxx11::string::append(local_118);
        }
        else {
          __val_00 = uVar30 - ((*(ushort *)&pfVar36->field_0x59 >> 4 & 1) != 0);
          cVar33 = '\x01';
          if (9 < __val_00) {
            uVar28 = __val_00;
            cVar10 = '\x04';
            do {
              cVar33 = cVar10;
              if (uVar28 < 100) {
                cVar33 = cVar33 + -2;
                goto LAB_0010da09;
              }
              if (uVar28 < 1000) {
                cVar33 = cVar33 + -1;
                goto LAB_0010da09;
              }
              if (uVar28 < 10000) goto LAB_0010da09;
              bVar8 = 99999 < uVar28;
              uVar28 = uVar28 / 10000;
              cVar10 = cVar33 + '\x04';
            } while (bVar8);
            cVar33 = cVar33 + '\x01';
          }
LAB_0010da09:
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          std::__cxx11::string::_M_construct((ulong)(local_1f0 + 0x10),cVar33);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1e0._M_dataplus._M_p,(uint)local_1e0._M_string_length,__val_00);
          plVar14 = (long *)std::__cxx11::string::replace
                                      ((ulong)(local_1f0 + 0x10),0,(char *)0x0,0x13980f);
          local_200._0_8_ = local_1f0;
          pPVar25 = (PyTypeObject *)(plVar14 + 2);
          if ((PyTypeObject *)*plVar14 == pPVar25) {
            local_1f0._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_1f0._8_8_ = plVar14[3];
          }
          else {
            local_1f0._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_200._0_8_ = (PyTypeObject *)*plVar14;
          }
          local_200._8_8_ = plVar14[1];
          *plVar14 = (long)pPVar25;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::__cxx11::string::_M_append(local_118,local_200._0_8_);
          pfVar36 = local_d8;
          if ((PyTypeObject *)local_200._0_8_ != (PyTypeObject *)local_1f0) {
            operator_delete((void *)local_200._0_8_,(ulong)(local_1f0._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append(local_118);
      }
    }
    else {
      if (bVar3 != 0x7d) goto LAB_0010d481;
      lVar6 = (long)(pfVar36->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar30 < (ulong)((long)*(pointer *)
                                   ((long)&(pfVar36->args).
                                           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                           ._M_impl + 8) - lVar6 >> 5)) &&
         (*(long *)(lVar6 + 8 + uVar30 * 0x20) != 0)) {
        std::__cxx11::string::append(local_118);
        std::__cxx11::string::append(local_118);
      }
      uVar30 = uVar30 + 1;
      if (uVar30 == pfVar36->nargs_pos_only && pfVar36->nargs_pos_only != 0) {
        std::__cxx11::string::append(local_118);
      }
    }
LAB_0010db01:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((uVar30 != local_120) ||
     ((type_info *)(&local_150->bf_getbuffer)[(long)local_180] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar13 = strdup_guard::operator()(&local_f8,(char *)local_118._0_8_);
  pfVar36->signature = pcVar13;
  if (*(pointer *)
       ((long)&(pfVar36->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl + 0x10) !=
      *(pointer *)
       ((long)&(pfVar36->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl + 8)) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                *)local_a0);
  }
  pfVar36->nargs = (uint16_t)local_120;
  pPVar21 = (pfVar36->sibling).m_ptr;
  if (pPVar21 == (PyObject *)0x0) {
LAB_0010dcb1:
    pPVar19 = (PyMethodDef *)operator_new(0x20);
    pfVar36->def = pPVar19;
    *(undefined8 *)&pPVar19->ml_flags = 0;
    pPVar19->ml_doc = (char *)0x0;
    pPVar19->ml_name = pfVar36->name;
    pPVar19->ml_meth = dispatcher;
    pPVar19->ml_flags = 3;
    pfVar18 = (local_b0->_M_t).
              super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              ._M_t.
              super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
    (local_b0->_M_t).
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         (function_record *)0x0;
    capsule::capsule((capsule *)(local_1f0 + 0x10),pfVar18,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    if (local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_1c0._M_dataplus._M_p = (pointer)0x0;
    pPVar21 = (pfVar36->scope).m_ptr;
    if (pPVar21 != (PyObject *)0x0) {
      iVar11 = PyObject_HasAttrString(pPVar21,"__module__");
      if (iVar11 == 1) {
        local_200._8_8_ = (pfVar36->scope).m_ptr;
        local_1f0._0_8_ = "__module__";
        local_1f0._8_8_ = 0;
        poVar20 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_200);
      }
      else {
        iVar11 = PyObject_HasAttrString((pfVar36->scope).m_ptr,"__name__");
        if (iVar11 != 1) goto LAB_0010dddb;
        local_200._8_8_ = (pfVar36->scope).m_ptr;
        local_1f0._0_8_ = "__name__";
        local_1f0._8_8_ = 0;
        poVar20 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_200);
      }
      local_1a0._0_8_ = (poVar20->super_handle).m_ptr;
      if ((PyTypeObject *)local_1a0._0_8_ != (PyTypeObject *)0x0) {
        (((PyVarObject *)&((PyObject *)local_1a0._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
             (((PyVarObject *)&((PyObject *)local_1a0._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
      }
      object::operator=((object *)&local_1c0,(object *)local_1a0);
      object::~object((object *)local_1a0);
      object::~object((object *)(local_1f0 + 8));
    }
LAB_0010dddb:
    pPVar21 = (PyObject *)
              PyCMethod_New(pfVar36->def,local_1e0._M_dataplus._M_p,local_1c0._M_dataplus._M_p,0);
    (local_128->super_function).super_object.super_handle.m_ptr = pPVar21;
    if (pPVar21 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    object::~object((object *)&local_1c0);
    object::~object((object *)(local_1f0 + 0x10));
    p_Var23 = (inquiry)local_1f0;
    local_200._8_8_ = (PyObject *)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    uVar30 = CONCAT71((int7)(uVar30 >> 8),1);
    pfVar18 = pfVar36;
    local_200._0_8_ = p_Var23;
    local_a8 = p_Var23;
  }
  else {
    if (pPVar21->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar21 = (PyObject *)pPVar21[1].ob_refcnt;
      (pfVar36->sibling).m_ptr = pPVar21;
      if (pPVar21 == (PyObject *)0x0) goto LAB_0010dcb1;
    }
    if (pPVar21->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar11 = PyType_IsSubtype(pPVar21->ob_type,&PyCFunction_Type);
      pPVar21 = (pfVar36->sibling).m_ptr;
      if (iVar11 == 0) {
        if ((pPVar21 != (PyObject *)&_Py_NoneStruct) && (*pfVar36->name != '_')) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c0,pfVar36->name,(allocator<char> *)local_1a0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1f0 + 0x10),"Cannot overload existing non-function object \"",
                         &local_1c0);
          plVar14 = (long *)std::__cxx11::string::append(local_1f0 + 0x10);
          local_200._0_8_ = *plVar14;
          psVar27 = (size_type *)(plVar14 + 2);
          if ((size_type *)local_200._0_8_ == psVar27) {
            local_1f0._0_8_ = *psVar27;
            local_1f0._8_8_ = plVar14[3];
            local_200._0_8_ = local_1f0;
          }
          else {
            local_1f0._0_8_ = *psVar27;
          }
          local_200._8_8_ = plVar14[1];
          *plVar14 = (long)psVar27;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          pybind11_fail((string *)local_200);
        }
        goto LAB_0010dcb1;
      }
    }
    if ((*(byte *)(pPVar21[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_200._0_8_ = pPVar21[1].ob_type;
      if ((PyTypeObject *)local_200._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_200._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_200._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
    }
    else {
      local_200._0_8_ = (PyTypeObject *)0x0;
    }
    pfVar18 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_200);
    pPVar21 = (pfVar18->scope).m_ptr;
    pPVar22 = (pfVar36->scope).m_ptr;
    object::~object((object *)local_200);
    if (pPVar21 != pPVar22) goto LAB_0010dcb1;
    pPVar21 = (pfVar36->sibling).m_ptr;
    (local_128->super_function).super_object.super_handle.m_ptr = pPVar21;
    if (pPVar21 != (PyObject *)0x0) {
      pPVar21->ob_refcnt = pPVar21->ob_refcnt + 1;
    }
    uVar24 = *(ushort *)&pfVar36->field_0x59;
    if (((*(ushort *)&pfVar18->field_0x59 ^ uVar24) & 0x10) != 0) {
      iVar11 = 0x139dd2;
      if ((uVar24 & 0x10) == 0) {
        iVar11 = 0x139988;
      }
      local_d0._0_8_ = &local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,iVar11,((uVar24 & 0x10) >> 3) + iVar11 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0)
      ;
      plVar14 = (long *)std::__cxx11::string::append(local_178);
      local_148._0_8_ = *plVar14;
      plVar31 = plVar14 + 2;
      if ((long *)local_148._0_8_ == plVar31) {
        local_138._0_8_ = *plVar31;
        local_138._8_8_ = plVar14[3];
        local_148._0_8_ = local_138;
      }
      else {
        local_138._0_8_ = *plVar31;
      }
      local_148._8_8_ = plVar14[1];
      *plVar14 = (long)plVar31;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      local_50.obj.m_ptr = (local_d8->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_98,&local_50);
      str::operator_cast_to_string(&local_70,&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     &local_70);
      plVar14 = (long *)std::__cxx11::string::append(local_1a0);
      local_1c0._M_dataplus._M_p = (pointer)*plVar14;
      plVar31 = plVar14 + 2;
      if ((long *)local_1c0._M_dataplus._M_p == plVar31) {
        local_1c0.field_2._M_allocated_capacity = *plVar31;
        local_1c0.field_2._8_8_ = plVar14[3];
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = *plVar31;
      }
      local_1c0._M_string_length = plVar14[1];
      *plVar14 = (long)plVar31;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_d8->name,&local_151);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1f0 + 0x10),&local_1c0,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_1f0 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
      ;
      pybind11_fail((string *)local_200);
    }
    pfVar7 = pfVar18;
    if ((uVar24 >> 8 & 1) == 0) {
      do {
        pfVar29 = pfVar7;
        pfVar7 = pfVar29->next;
      } while (pfVar7 != (function_record *)0x0);
      pfVar7 = (local_b0->_M_t).
               super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
               ._M_t.
               super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
               .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      (local_b0->_M_t).
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           (function_record *)0x0;
      pfVar29->next = pfVar7;
      if (local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    else {
      pfVar36->next = pfVar18;
      local_200._0_8_ = pPVar21[1].ob_type;
      if ((PyTypeObject *)local_200._0_8_ != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_200._0_8_)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_200._0_8_)->ob_base).ob_base.ob_refcnt + 1;
      }
      pfVar18 = (local_b0->_M_t).
                super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                ._M_t.
                super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      (local_b0->_M_t).
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           (function_record *)0x0;
      iVar11 = PyCapsule_SetPointer(local_200._0_8_,pfVar18);
      if (iVar11 != 0) {
        pybind11_fail("Could not set capsule pointer");
      }
      if (local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      object::~object((object *)local_200);
      pfVar18 = pfVar36;
    }
    p_Var23 = (inquiry)local_1f0;
    local_200._8_8_ = (PyObject *)0x0;
    local_1f0._0_8_ = local_1f0._0_8_ & 0xffffffffffffff00;
    local_200._0_8_ = p_Var23;
    if (DAT_001436d1 == 1) {
      std::__cxx11::string::append(local_200);
      std::__cxx11::string::append(local_200);
      p_Var23 = (inquiry)std::__cxx11::string::append(local_200);
    }
    if (pfVar18 == (function_record *)0x0) goto LAB_0010e09a;
    uVar30 = 0;
  }
  iVar11 = 0;
  local_150 = (PyBufferProcs *)
              CONCAT44(local_150._4_4_,(int)CONCAT71((int7)((ulong)p_Var23 >> 8),1));
  local_120 = CONCAT44(local_120._4_4_,(int)uVar30);
  do {
    if (DAT_001436d1 == 1) {
      if (0 < iVar11) {
        std::__cxx11::string::append(local_200);
      }
      if ((char)uVar30 == '\0') {
        uVar37 = iVar11 + 1;
        local_180 = (PyMappingMethods *)CONCAT44(local_180._4_4_,uVar37);
        __val = -uVar37;
        if (0 < (int)uVar37) {
          __val = uVar37;
        }
        __len = 1;
        if (9 < __val) {
          uVar30 = (ulong)__val;
          uVar9 = 4;
          do {
            __len = uVar9;
            uVar12 = (uint)uVar30;
            if (uVar12 < 100) {
              __len = __len - 2;
              goto LAB_0010dee5;
            }
            if (uVar12 < 1000) {
              __len = __len - 1;
              goto LAB_0010dee5;
            }
            if (uVar12 < 10000) goto LAB_0010dee5;
            uVar30 = uVar30 / 10000;
            uVar9 = __len + 4;
          } while (99999 < uVar12);
          __len = __len + 1;
        }
LAB_0010dee5:
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_1c0,(char)__len - (char)((int)uVar37 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1c0._M_dataplus._M_p + (uVar37 >> 0x1f),__len,__val);
        puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
        pfVar36 = local_d8;
        psVar27 = puVar15 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar15 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar27) {
          local_1e0.field_2._M_allocated_capacity = *psVar27;
          local_1e0.field_2._8_8_ = puVar15[3];
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar27;
          local_1e0._M_dataplus._M_p = (pointer)*puVar15;
        }
        iVar11 = (int)local_180;
        local_1e0._M_string_length = puVar15[1];
        *puVar15 = psVar27;
        puVar15[1] = 0;
        *(undefined1 *)(puVar15 + 2) = 0;
        std::__cxx11::string::_M_append(local_200,(ulong)local_1e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        uVar30 = local_120 & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
        }
      }
      std::__cxx11::string::append(local_200);
      std::__cxx11::string::append(local_200);
      std::__cxx11::string::append(local_200);
    }
    if (((pfVar18->doc != (char *)0x0) && (*pfVar18->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (((DAT_001436d1 | (byte)local_150) & 1) == 0) {
        std::__cxx11::string::append(local_200);
        local_150 = (PyBufferProcs *)((ulong)local_150 & 0xffffffff00000000);
      }
      else {
        local_150 = (PyBufferProcs *)
                    CONCAT44(local_150._4_4_,
                             CONCAT31((int3)((ulong)local_150 >> 8),(byte)local_150 & DAT_001436d1))
        ;
      }
      if ((DAT_001436d1 & 1) != 0) {
        std::__cxx11::string::append(local_200);
      }
      std::__cxx11::string::append(local_200);
      if (DAT_001436d1 == 1) {
        std::__cxx11::string::append(local_200);
      }
    }
    pfVar18 = pfVar18->next;
  } while (pfVar18 != (function_record *)0x0);
LAB_0010e09a:
  pPVar21 = (local_128->super_function).super_object.super_handle.m_ptr;
  free(*(void **)(pPVar21[1].ob_refcnt + 0x18));
  if ((PyObject *)local_200._8_8_ == (PyObject *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    pcVar13 = strdup((char *)local_200._0_8_);
  }
  p_Var23 = local_a8;
  *(char **)(pPVar21[1].ob_refcnt + 0x18) = pcVar13;
  if ((pfVar36->field_0x59 & 0x10) != 0) {
    pPVar22 = (PyObject *)
              PyInstanceMethod_New((local_128->super_function).super_object.super_handle.m_ptr);
    (local_128->super_function).super_object.super_handle.m_ptr = pPVar22;
    if (pPVar22 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    pPVar21->ob_refcnt = pPVar21->ob_refcnt + -1;
    if (pPVar21->ob_refcnt == 0) {
      _Py_Dealloc(pPVar21);
    }
  }
  if ((inquiry)local_200._0_8_ != p_Var23) {
    operator_delete((void *)local_200._0_8_,local_1f0._0_8_ + 1);
  }
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,
                    CONCAT71(local_108._M_allocated_capacity._1_7_,local_108._M_local_buf[0]) + 1);
  }
  strdup_guard::~strdup_guard(&local_f8);
  return;
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec, const char *text,
                            const std::type_info *const *types, size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destuct the pointer. `initialize` (the caller) still relies on the
        // pointee being alive after this call. Only move out if a `capsule` is going to keep it alive.
        auto rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the strings
        // are only referenced before strdup'ing. So only *after* the following block could `destruct`
        // safely be called, but even then, `repr` could still throw in the middle of copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = guarded_strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = guarded_strdup(a.name);
            if (a.descr)
                a.descr = guarded_strdup(a.descr);
            else if (a.value)
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("__nonzero__");
        }
#endif
        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(), [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc = signatures.empty() ? nullptr : strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }